

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.h
# Opt level: O2

ByteData * __thiscall
cfd::core::ByteData::Concat<cfd::core::ByteData256,cfd::core::ByteData,cfd::core::ByteData>
          (ByteData *__return_storage_ptr__,ByteData *this,ByteData256 *top,ByteData *args,
          ByteData *args_1)

{
  ByteData result;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_38;
  
  Concat<cfd::core::ByteData256>((ByteData *)&_Stack_38,this,top);
  Concat<cfd::core::ByteData,cfd::core::ByteData>
            (__return_storage_ptr__,(ByteData *)&_Stack_38,args,args_1);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_38);
  return __return_storage_ptr__;
}

Assistant:

ByteData Concat(const ByteTop& top, const ByteDataClass&... args) const {
    ByteData result = Concat(top);
    return result.Concat(args...);
  }